

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Logging.cpp
# Opt level: O3

void __thiscall
RenX_LoggingPlugin::RenX_OnVoteKick
          (RenX_LoggingPlugin *this,Server *server,TeamType *param_2,PlayerInfo *player,
          PlayerInfo *victim)

{
  pointer pcVar1;
  code *pcVar2;
  string msg;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  if ((this->field_0xa8 & 1) == 0) {
    pcVar2 = RenX::Server::sendAdmChan;
  }
  else {
    pcVar2 = RenX::Server::sendLogChan;
  }
  pcVar1 = (this->voteKickFmt)._M_dataplus._M_p;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + (this->voteKickFmt)._M_string_length);
  if (local_48 != 0) {
    RenX::processTags((string *)&local_50,server,player,victim,(BuildingInfo *)0x0);
    (*pcVar2)(server,local_48,local_50);
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return;
}

Assistant:

void RenX_LoggingPlugin::RenX_OnVoteKick(RenX::Server &server, const RenX::TeamType &, const RenX::PlayerInfo &player, const RenX::PlayerInfo &victim)
{
	logFuncType func;
	if (RenX_LoggingPlugin::voteCallPublic)
		func = &RenX::Server::sendLogChan;
	else
		func = &RenX::Server::sendAdmChan;

	std::string msg = this->voteKickFmt;
	if (!msg.empty())
	{
		RenX::processTags(msg, &server, &player, &victim);
		(server.*func)(msg);
	}
}